

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O0

void InitUserData(UserData data)

{
  sunrealtype KV0;
  sunrealtype VEL;
  sunrealtype KH;
  sunrealtype A4;
  sunrealtype A3;
  sunrealtype C3;
  sunrealtype Q2;
  sunrealtype Q1;
  UserData data_local;
  
  data->om = 7.272205216643056e-05;
  data->dx = 1.4285714285714286;
  data->dz = 1.4285714285714286;
  data->hdco = 4e-06 / (data->dx * data->dx);
  data->haco = 0.001 / (data->dx * 2.0);
  data->vdco = (1.0 / (data->dz * data->dz)) * 1e-08;
  *data->p = 1.63e-16;
  data->p[1] = 4.66e-16;
  data->p[2] = 3.7e+16;
  data->p[3] = 22.62;
  data->p[4] = 7.601;
  data->p[5] = 4e-06;
  data->p[6] = 0.001;
  data->p[7] = 1e-08;
  return;
}

Assistant:

static void InitUserData(UserData data)
{
  sunrealtype Q1, Q2, C3, A3, A4, KH, VEL, KV0;

  /* Set problem parameters */
  Q1  = SUN_RCONST(1.63e-16); /* Q1  coefficients q1, q2, c3             */
  Q2  = SUN_RCONST(4.66e-16); /* Q2                                      */
  C3  = SUN_RCONST(3.7e16);   /* C3                                      */
  A3  = SUN_RCONST(22.62);    /* A3  coefficient in expression for q3(t) */
  A4  = SUN_RCONST(7.601);    /* A4  coefficient in expression for q4(t) */
  KH  = SUN_RCONST(4.0e-6);   /* KH  horizontal diffusivity Kh           */
  VEL = SUN_RCONST(0.001);    /* VEL advection velocity V                */
  KV0 = SUN_RCONST(1.0e-8);   /* KV0 coefficient in Kv(z)                */

  data->om   = PI / HALFDAY;
  data->dx   = (XMAX - XMIN) / (MX - 1);
  data->dz   = (ZMAX - ZMIN) / (MZ - 1);
  data->hdco = KH / SQR(data->dx);
  data->haco = VEL / (SUN_RCONST(2.0) * data->dx);
  data->vdco = (ONE / SQR(data->dz)) * KV0;

  data->p[0] = Q1;
  data->p[1] = Q2;
  data->p[2] = C3;
  data->p[3] = A3;
  data->p[4] = A4;
  data->p[5] = KH;
  data->p[6] = VEL;
  data->p[7] = KV0;
}